

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferAttachmentLayeredCase::iterate
          (FramebufferAttachmentLayeredCase *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  ContextInfo *this_00;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  Enum<int,_2UL> local_710;
  char *local_700;
  MessageBuilder local_6f8;
  MessageBuilder local_578;
  GetNameFunc local_3f8;
  int local_3f0;
  Enum<int,_2UL> local_3e8;
  MessageBuilder local_3d8;
  undefined4 local_254;
  MessageBuilder local_250;
  deUint32 local_d0;
  ContextType local_cc;
  int local_c8;
  GLint local_c4;
  int face;
  GLint layered;
  Texture texture;
  Framebuffer fbo;
  string local_88;
  allocator<char> local_61;
  string local_60;
  ScopedLogSection local_40;
  ScopedLogSection section;
  int ndx;
  undefined1 local_28 [8];
  CallLogWrapper gl;
  FramebufferAttachmentLayeredCase *this_local;
  
  gl._16_8_ = this;
  pRVar6 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar3),pTVar7);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  section.m_log._0_4_ = 0;
  do {
    if (5 < (int)section.m_log) {
      local_254 = 1;
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
      return STOP;
    }
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    pcVar1 = iterate::textureTypes[(int)section.m_log].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
    pcVar1 = iterate::textureTypes[(int)section.m_log].description;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,pcVar1,(allocator<char> *)&fbo.super_ObjectWrapper.field_0x17);
    tcu::ScopedLogSection::ScopedLogSection(&local_40,pTVar7,&local_60,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&fbo.super_ObjectWrapper.field_0x17);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture.super_ObjectWrapper.m_object,
               pRVar6);
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)0> *)&face,pRVar6);
    local_c4 = -1;
    dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)local_28,0x8ca9,dVar4);
    if ((iterate::textureTypes[(int)section.m_log].type == TEXTURE_3D) ||
       (iterate::textureTypes[(int)section.m_log].type == TEXTURE_3D_LAYER)) {
      dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
      glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x806f,dVar4);
      glu::CallLogWrapper::glTexImage3D
                ((CallLogWrapper *)local_28,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,
                 (void *)0x0);
      glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x806f,0x2800,0x2600);
      glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x806f,0x2801,0x2600);
      if (iterate::textureTypes[(int)section.m_log].type == TEXTURE_3D) {
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0);
      }
      else {
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glFramebufferTextureLayer
                  ((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0,2);
      }
LAB_020228dd:
      GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
      glu::checkError(GVar5,"setup attachment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0x13f6);
      glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
                ((CallLogWrapper *)local_28,0x8ca9,0x8ce0,0x8da7,&local_c4);
      GVar5 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
      glu::checkError(GVar5,"getFramebufferParameteriv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0x13f9);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase
                          .super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_3d8,(char (*) [37])"GL_FRAMEBUFFER_ATTACHMENT_LAYERED = ");
      EVar9 = glu::getBooleanStr(local_c4);
      local_3f8 = EVar9.m_getName;
      local_3f0 = EVar9.m_value;
      local_3e8.m_getName = local_3f8;
      local_3e8.m_value = local_3f0;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3e8);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d8);
      if ((local_c4 == 1) || (local_c4 == 0)) {
        if ((local_c4 == 1) != (bool)(iterate::textureTypes[(int)section.m_log].layered & 1U)) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.
                              super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_6f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<(&local_6f8,(char (*) [17])0x2c17aa1);
          local_700 = "mapped_ == GL_FALSE";
          if ((iterate::textureTypes[(int)section.m_log].layered & 1U) != 0) {
            local_700 = "mapped_ == GL_TRUE";
          }
          local_700 = local_700 + 0xb;
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_700);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2c59494);
          EVar9 = glu::getBooleanStr(local_c4);
          local_710.m_getName = EVar9.m_getName;
          local_710.m_value = EVar9.m_value;
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_710);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6f8);
          tcu::TestContext::setTestResult
                    ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
        }
      }
      else {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_GeometryShaderFeartureTestCase).super_TestCase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_578,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_578,(char (*) [30])"Error, expected boolean, got ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c4);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_578);
        tcu::TestContext::setTestResult
                  ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid boolean");
      }
      local_254 = 0;
    }
    else {
      if ((iterate::textureTypes[(int)section.m_log].type == TEXTURE_2D_ARRAY) ||
         (iterate::textureTypes[(int)section.m_log].type == TEXTURE_2D_ARRAY_LAYER)) {
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x8c1a,dVar4);
        glu::CallLogWrapper::glTexImage3D
                  ((CallLogWrapper *)local_28,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,
                   (void *)0x0);
        glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2800,0x2600);
        glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2801,0x2600);
        if (iterate::textureTypes[(int)section.m_log].type == TEXTURE_2D_ARRAY) {
          dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
          glu::CallLogWrapper::glFramebufferTexture
                    ((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0);
        }
        else {
          dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
          glu::CallLogWrapper::glFramebufferTextureLayer
                    ((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0,3);
        }
        goto LAB_020228dd;
      }
      if (iterate::textureTypes[(int)section.m_log].type == TEXTURE_CUBE) {
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x8513,dVar4);
        for (local_c8 = 0; local_c8 < 6; local_c8 = local_c8 + 1) {
          glu::CallLogWrapper::glTexImage2D
                    ((CallLogWrapper *)local_28,local_c8 + 0x8515,0,0x8058,0x20,0x20,0,0x1908,0x1401
                     ,(void *)0x0);
        }
        glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8513,0x2800,0x2600);
        glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8513,0x2801,0x2600);
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0);
        goto LAB_020228dd;
      }
      if (iterate::textureTypes[(int)section.m_log].type != TEXTURE_2D_MS_ARRAY) goto LAB_020228dd;
      pRVar6 = gles31::Context::getRenderContext
                         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
      local_cc.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
      local_d0 = (deUint32)glu::ApiType::es(3,2);
      bVar2 = glu::contextSupports(local_cc,(ApiType)local_d0);
      if (bVar2) {
LAB_0202285e:
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x9102,dVar4);
        glu::CallLogWrapper::glTexStorage3DMultisample
                  ((CallLogWrapper *)local_28,0x9102,1,0x8058,0x20,0x20,0x20,'\0');
        dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&face);
        glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar4,0);
        goto LAB_020228dd;
      }
      this_00 = gles31::Context::getContextInfo
                          ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (this_00,"GL_OES_texture_storage_multisample_2d_array");
      if (bVar2) goto LAB_0202285e;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase
                          .super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_250,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_250,
                          (char (*) [115])
                          "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping."
                         );
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_250);
      local_254 = 4;
    }
    glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)0> *)&face);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture.super_ObjectWrapper.m_object);
    tcu::ScopedLogSection::~ScopedLogSection(&local_40);
    section.m_log._0_4_ = (int)section.m_log + 1;
  } while( true );
}

Assistant:

FramebufferAttachmentLayeredCase::IterateResult FramebufferAttachmentLayeredCase::iterate (void)
{
	enum CaseType
	{
		TEXTURE_3D,
		TEXTURE_2D_ARRAY,
		TEXTURE_CUBE,
		TEXTURE_2D_MS_ARRAY,
		TEXTURE_3D_LAYER,
		TEXTURE_2D_ARRAY_LAYER,
	};

	static const struct TextureType
	{
		const char*	name;
		const char*	description;
		bool		layered;
		CaseType	type;
	} textureTypes[] =
	{
		{ "3D",				"3D texture",			true,	TEXTURE_3D				},
		{ "2DArray",		"2D array",				true,	TEXTURE_2D_ARRAY		},
		{ "Cube",			"Cube map",				true,	TEXTURE_CUBE			},
		{ "2DMSArray",		"2D multisample array",	true,	TEXTURE_2D_MS_ARRAY		},
		{ "3DLayer",		"3D texture layer ",	false,	TEXTURE_3D_LAYER		},
		{ "2DArrayLayer",	"2D array layer ",		false,	TEXTURE_2D_ARRAY_LAYER	},
	};

	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTypes); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), textureTypes[ndx].name, textureTypes[ndx].description);
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture			(m_context.getRenderContext());
		glw::GLint					layered			= -1;

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);

		if (textureTypes[ndx].type == TEXTURE_3D || textureTypes[ndx].type == TEXTURE_3D_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_3D, *texture);
			gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_3D)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 2);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_ARRAY || textureTypes[ndx].type == TEXTURE_2D_ARRAY_LAYER)
		{
			gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture);
			gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			if (textureTypes[ndx].type == TEXTURE_2D_ARRAY)
				gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
			else
				gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0, 3);
		}
		else if (textureTypes[ndx].type == TEXTURE_CUBE)
		{
			gl.glBindTexture(GL_TEXTURE_CUBE_MAP, *texture);
			for (int face = 0; face < 6; ++face)
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}
		else if (textureTypes[ndx].type == TEXTURE_2D_MS_ARRAY)
		{
			// check extension
			if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Context is not equal or greather than 3.2 and GL_OES_texture_storage_multisample_2d_array not supported, skipping." << tcu::TestLog::EndMessage;
				continue;
			}

			gl.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, *texture);
			gl.glTexStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 1, GL_RGBA8, 32, 32, 32, GL_FALSE);
			gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture, 0);
		}

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup attachment");

		gl.glGetFramebufferAttachmentParameteriv(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_LAYERED, &layered);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getFramebufferParameteriv");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_FRAMEBUFFER_ATTACHMENT_LAYERED = " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;

		if (layered != GL_TRUE && layered != GL_FALSE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected boolean, got " << layered << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid boolean");
		}
		else if ((layered == GL_TRUE) != textureTypes[ndx].layered)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected " << ((textureTypes[ndx].layered) ? ("GL_TRUE") : ("GL_FALSE")) << ", got " << glu::getBooleanStr(layered) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}